

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O2

int __thiscall glslang::TPpContext::CPPif(TPpContext *this,TPpToken *ppToken)

{
  int iVar1;
  bool err;
  int res;
  
  iVar1 = scanToken(this,ppToken);
  if ((this->ifdepth < 0x41) && (this->elsetracker < 0x41)) {
    this->elsetracker = this->elsetracker + 1;
    this->ifdepth = this->ifdepth + 1;
    res = 0;
    err = false;
    iVar1 = eval(this,iVar1,0,false,&res,&err,ppToken);
    iVar1 = extraTokenCheck(this,0xa5,ppToken,iVar1);
    if ((res == 0) && (err == false)) {
      iVar1 = CPPelse(this,1,ppToken);
    }
  }
  else {
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,ppToken,"maximum nesting depth exceeded","#if","");
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int TPpContext::CPPif(TPpToken* ppToken)
{
    int token = scanToken(ppToken);
    if (ifdepth >= maxIfNesting || elsetracker >= maxIfNesting) {
        parseContext.ppError(ppToken->loc, "maximum nesting depth exceeded", "#if", "");
        return EndOfInput;
    } else {
        elsetracker++;
        ifdepth++;
    }
    int res = 0;
    bool err = false;
    token = eval(token, MIN_PRECEDENCE, false, res, err, ppToken);
    token = extraTokenCheck(PpAtomIf, ppToken, token);
    if (!res && !err)
        token = CPPelse(1, ppToken);

    return token;
}